

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

NULLCRef * NULLCTypeInfo::GetPointerTarget(NULLCRef obj)

{
  uint *puVar1;
  uint uVar2;
  char *__function;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x6b,"NULLCRef NULLCTypeInfo::GetPointerTarget(NULLCRef)");
  }
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    puVar1 = (uint *)(*(long *)(linker + 0x200) + (ulong)in_stack_00000008 * 0x50);
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)in_stack_00000008 * 0x50) == 2) {
      in_RDI->ptr = *(char **)CONCAT44(obj.typeID,in_stack_0000000c);
      in_RDI->typeID = puVar1[9];
    }
    else {
      uVar2 = *puVar1;
      if (*(uint *)(linker + 0x29c) <= uVar2) {
        __function = 
        "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_0012ac9c;
      }
      nullcThrowError("pointerGetTarget: \'%s\' is not a pointer",
                      (ulong)uVar2 + *(long *)(linker + 0x290));
      *(undefined4 *)((long)&in_RDI->ptr + 4) = 0;
      *(undefined8 *)in_RDI = 0;
    }
    return in_RDI;
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0012ac9c:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

NULLCRef GetPointerTarget(NULLCRef obj)
	{
		assert(linker);

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_POINTER)
		{
			nullcThrowError("pointerGetTarget: '%s' is not a pointer", &linker->exSymbols[type.offsetToName]);

			NULLCRef r = { 0, 0 };
			return r;
		}

		NULLCRef r;
		r.ptr = *(char**)obj.ptr;
		r.typeID = type.subType;
		return r;
	}